

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_visitor.hpp
# Opt level: O0

optional_idx *
duckdb::TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
          (LogicalType *type,anon_class_1_0_00000001 *func)

{
  LogicalTypeId LVar1;
  bool bVar2;
  LogicalType *pLVar3;
  anon_class_1_0_00000001 *this;
  LogicalType *in_RDX;
  LogicalType *in_RSI;
  optional_idx *in_RDI;
  LogicalType value;
  LogicalType key;
  LogicalType child_3;
  LogicalType child_2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *child_1;
  iterator __end3_1;
  iterator __begin3_1;
  child_list_t<LogicalType> *__range3_1;
  child_list_t<LogicalType> children_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *child;
  iterator __end3;
  iterator __begin3;
  child_list_t<LogicalType> *__range3;
  child_list_t<LogicalType> children;
  LogicalType *in_stack_fffffffffffffd68;
  LogicalType *in_stack_fffffffffffffd70;
  anon_class_1_0_00000001 *in_stack_fffffffffffffd78;
  idx_t in_stack_fffffffffffffda8;
  optional_idx *this_00;
  LogicalType local_238 [24];
  LogicalType local_220 [24];
  LogicalType local_208 [24];
  LogicalType local_1f0 [24];
  LogicalType local_1d8 [32];
  LogicalType local_1b8 [24];
  LogicalType local_1a0 [24];
  LogicalType local_188 [24];
  LogicalType local_170 [24];
  LogicalType local_158 [24];
  LogicalType local_140 [24];
  undefined1 local_128 [24];
  LogicalType local_110 [24];
  LogicalType local_f8 [24];
  reference local_e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *local_d8;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
  local_d0;
  LogicalType *local_c8;
  LogicalType local_c0 [24];
  undefined1 local_a8 [24];
  LogicalType local_90 [40];
  LogicalType local_68 [24];
  reference local_50;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *local_48;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
  local_40;
  undefined1 *local_38;
  undefined1 local_30 [16];
  anon_class_1_0_00000001 *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  LVar1 = LogicalType::id(in_RSI);
  switch(LVar1) {
  case STRUCT:
    duckdb::StructType::GetChildTypes_abi_cxx11_(in_RSI);
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
              *)in_stack_fffffffffffffd70,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
              *)in_stack_fffffffffffffd68);
    local_38 = local_30;
    local_40._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                     *)in_stack_fffffffffffffd68);
    local_48 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                *)std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                         *)in_stack_fffffffffffffd68);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                               *)in_stack_fffffffffffffd70,
                              (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                               *)in_stack_fffffffffffffd68), bVar2) {
      local_50 = __gnu_cxx::
                 __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                 ::operator*(&local_40);
      VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                (in_RDX,in_stack_ffffffffffffffe0);
      LogicalType::operator=(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      duckdb::LogicalType::~LogicalType(local_68);
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
      ::operator++(&local_40);
    }
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
              *)in_stack_fffffffffffffd70,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
              *)in_stack_fffffffffffffd68);
    duckdb::LogicalType::STRUCT(local_90,local_a8);
    ParquetWriteSelect::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    duckdb::LogicalType::~LogicalType(local_90);
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
               *)0x63438c);
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
               *)0x634399);
    break;
  case LIST:
    pLVar3 = (LogicalType *)duckdb::ListType::GetChildType(in_RSI);
    duckdb::LogicalType::LogicalType(local_140,pLVar3);
    VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
              (in_RDX,in_stack_ffffffffffffffe0);
    duckdb::LogicalType::LIST(local_158);
    ParquetWriteSelect::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    duckdb::LogicalType::~LogicalType(local_158);
    duckdb::LogicalType::~LogicalType(local_170);
    duckdb::LogicalType::~LogicalType(local_140);
    break;
  case MAP:
    pLVar3 = (LogicalType *)duckdb::MapType::KeyType(in_RSI);
    duckdb::LogicalType::LogicalType(local_1d8,pLVar3);
    pLVar3 = (LogicalType *)duckdb::MapType::ValueType(in_RSI);
    duckdb::LogicalType::LogicalType(local_1f0,pLVar3);
    VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
              (in_RDX,in_stack_ffffffffffffffe0);
    VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
              (in_RDX,in_stack_ffffffffffffffe0);
    duckdb::LogicalType::MAP(local_208,local_220,local_238);
    ParquetWriteSelect::anon_class_1_0_00000001::operator()(in_stack_fffffffffffffd78,pLVar3);
    duckdb::LogicalType::~LogicalType(local_208);
    duckdb::LogicalType::~LogicalType(local_238);
    duckdb::LogicalType::~LogicalType(local_220);
    duckdb::LogicalType::~LogicalType(local_1f0);
    duckdb::LogicalType::~LogicalType(local_1d8);
    break;
  default:
    ParquetWriteSelect::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    break;
  case UNION:
    duckdb::UnionType::CopyMemberTypes_abi_cxx11_(local_c0);
    local_c8 = local_c0;
    local_d0._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                     *)in_stack_fffffffffffffd68);
    local_d8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                *)std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                         *)in_stack_fffffffffffffd68);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                               *)in_stack_fffffffffffffd70,
                              (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                               *)in_stack_fffffffffffffd68), bVar2) {
      local_e0 = __gnu_cxx::
                 __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                 ::operator*(&local_d0);
      VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                (in_RDX,in_stack_ffffffffffffffe0);
      LogicalType::operator=(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      duckdb::LogicalType::~LogicalType(local_f8);
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
      ::operator++(&local_d0);
    }
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
              *)in_stack_fffffffffffffd70,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
              *)in_stack_fffffffffffffd68);
    duckdb::LogicalType::UNION(local_110,local_128);
    ParquetWriteSelect::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    duckdb::LogicalType::~LogicalType(local_110);
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
               *)0x634558);
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
               *)0x634565);
    break;
  case ARRAY:
    pLVar3 = (LogicalType *)duckdb::ArrayType::GetChildType(in_RSI);
    duckdb::LogicalType::LogicalType(local_188,pLVar3);
    VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
              (in_RDX,in_stack_ffffffffffffffe0);
    this = (anon_class_1_0_00000001 *)duckdb::ArrayType::GetSize(in_RSI);
    optional_idx::optional_idx(this_00,in_stack_fffffffffffffda8);
    duckdb::LogicalType::ARRAY(local_1a0,(optional_idx)local_1b8);
    ParquetWriteSelect::anon_class_1_0_00000001::operator()(this,in_stack_fffffffffffffd70);
    duckdb::LogicalType::~LogicalType(local_1a0);
    duckdb::LogicalType::~LogicalType(local_1b8);
    duckdb::LogicalType::~LogicalType(local_188);
  }
  return in_RDI;
}

Assistant:

inline LogicalType TypeVisitor::VisitReplace(const LogicalType &type, F &&func) {
	switch (type.id()) {
	case LogicalTypeId::STRUCT: {
		auto children = StructType::GetChildTypes(type);
		for (auto &child : children) {
			child.second = VisitReplace(child.second, func);
		}
		return func(LogicalType::STRUCT(children));
	}
	case LogicalTypeId::UNION: {
		auto children = UnionType::CopyMemberTypes(type);
		for (auto &child : children) {
			child.second = VisitReplace(child.second, func);
		}
		return func(LogicalType::UNION(children));
	}
	case LogicalTypeId::LIST: {
		auto child = ListType::GetChildType(type);
		return func(LogicalType::LIST(VisitReplace(child, func)));
	}
	case LogicalTypeId::ARRAY: {
		auto child = ArrayType::GetChildType(type);
		return func(LogicalType::ARRAY(VisitReplace(child, func), ArrayType::GetSize(type)));
	}
	case LogicalTypeId::MAP: {
		auto key = MapType::KeyType(type);
		auto value = MapType::ValueType(type);
		return func(LogicalType::MAP(VisitReplace(key, func), VisitReplace(value, func)));
	}
	default:
		return func(type);
	}
}